

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastpackwithoutmask1_32(uint32_t *in,uint32_t *out)

{
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in;
  *out = in[1] << 1 | *out;
  *out = in[2] << 2 | *out;
  *out = in[3] << 3 | *out;
  *out = in[4] << 4 | *out;
  *out = in[5] << 5 | *out;
  *out = in[6] << 6 | *out;
  *out = in[7] << 7 | *out;
  *out = in[8] << 8 | *out;
  *out = in[9] << 9 | *out;
  *out = in[10] << 10 | *out;
  *out = in[0xb] << 0xb | *out;
  *out = in[0xc] << 0xc | *out;
  *out = in[0xd] << 0xd | *out;
  *out = in[0xe] << 0xe | *out;
  *out = in[0xf] << 0xf | *out;
  *out = in[0x10] << 0x10 | *out;
  *out = in[0x11] << 0x11 | *out;
  *out = in[0x12] << 0x12 | *out;
  *out = in[0x13] << 0x13 | *out;
  *out = in[0x14] << 0x14 | *out;
  *out = in[0x15] << 0x15 | *out;
  *out = in[0x16] << 0x16 | *out;
  *out = in[0x17] << 0x17 | *out;
  *out = in[0x18] << 0x18 | *out;
  *out = in[0x19] << 0x19 | *out;
  *out = in[0x1a] << 0x1a | *out;
  *out = in[0x1b] << 0x1b | *out;
  *out = in[0x1c] << 0x1c | *out;
  *out = in[0x1d] << 0x1d | *out;
  *out = in[0x1e] << 0x1e | *out;
  *out = in[0x1f] << 0x1f | *out;
  return out + 1;
}

Assistant:

uint32_t *__fastpackwithoutmask1_32(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 7;
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 11;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 15;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 17;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 19;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 21;
  ++in;
  *out |= ((*in)) << 22;
  ++in;
  *out |= ((*in)) << 23;
  ++in;
  *out |= ((*in)) << 24;
  ++in;
  *out |= ((*in)) << 25;
  ++in;
  *out |= ((*in)) << 26;
  ++in;
  *out |= ((*in)) << 27;
  ++in;
  *out |= ((*in)) << 28;
  ++in;
  *out |= ((*in)) << 29;
  ++in;
  *out |= ((*in)) << 30;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  ++in;

  return out;
}